

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O3

void sunStopTiming(sunTimerStruct *entry)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  clock_gettime(1,(timespec *)entry->toc);
  lVar2 = entry->toc->tv_nsec - entry->tic->tv_nsec;
  lVar1 = lVar2 + 1000000000;
  if (-1 < lVar2) {
    lVar1 = lVar2;
  }
  dVar3 = (double)lVar1 * 1e-09 +
          (double)((lVar2 >> 0x3f) + (entry->toc->tv_sec - entry->tic->tv_sec)) + entry->elapsed;
  entry->elapsed = dVar3;
  entry->average = dVar3;
  entry->maximum = dVar3;
  return;
}

Assistant:

static void sunStopTiming(sunTimerStruct* entry)
{
  long s_difference  = 0;
  long ns_difference = 0;

  sunclock_gettime_monotonic(entry->toc);

  s_difference  = entry->toc->tv_sec - entry->tic->tv_sec;
  ns_difference = entry->toc->tv_nsec - entry->tic->tv_nsec;
  if (ns_difference < 0)
  {
    s_difference--;
    ns_difference = 1000000000 + entry->toc->tv_nsec - entry->tic->tv_nsec;
  }

  entry->elapsed += ((double)s_difference) + ((double)ns_difference) * 1e-9;
  entry->average = entry->elapsed;
  entry->maximum = entry->elapsed;
}